

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

void __thiscall
slang::syntax::NamedArgumentSyntax::setChild
          (NamedArgumentSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_004d0a9c + *(int *)(&DAT_004d0a9c + index * 4)))();
  return;
}

Assistant:

void NamedArgumentSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: dot = child.token(); return;
        case 1: name = child.token(); return;
        case 2: openParen = child.token(); return;
        case 3: expr = child.node() ? &child.node()->as<PropertyExprSyntax>() : nullptr; return;
        case 4: closeParen = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}